

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

void icu_63::UCharsTrie::getNextBranchUChars(UChar *pos,int32_t length,Appendable *out)

{
  int32_t length_00;
  char16_t *pos_00;
  int iVar1;
  ulong uVar2;
  UChar *pUVar3;
  
  uVar2 = (ulong)(uint)length;
  while (pUVar3 = pos, iVar1 = (int)uVar2, 5 < iVar1) {
    pos_00 = jumpByDelta(pUVar3 + 1);
    length_00 = (int32_t)(uVar2 >> 1);
    getNextBranchUChars(pos_00,length_00,out);
    uVar2 = (ulong)(uint)(iVar1 - length_00);
    pos = pUVar3 + 2;
    if (0xfbff < (ushort)pUVar3[1]) {
      if (pUVar3[1] == L'\xffff') {
        pos = pUVar3 + 4;
      }
      else {
        pos = pUVar3 + 3;
      }
    }
  }
  iVar1 = iVar1 + 1;
  do {
    (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pUVar3);
    if ((ushort)(pUVar3[1] & 0x7fffU) < 0x4000) {
      pUVar3 = pUVar3 + 2;
    }
    else if ((pUVar3[1] & 0x7fffU) == 0x7fff) {
      pUVar3 = pUVar3 + 4;
    }
    else {
      pUVar3 = pUVar3 + 3;
    }
    iVar1 = iVar1 + -1;
  } while (2 < iVar1);
  (*(out->super_UObject)._vptr_UObject[3])(out,(ulong)(ushort)*pUVar3);
  return;
}

Assistant:

void
UCharsTrie::getNextBranchUChars(const UChar *pos, int32_t length, Appendable &out) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison unit
        getNextBranchUChars(jumpByDelta(pos), length>>1, out);
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        out.appendCodeUnit(*pos++);
        pos=skipValue(pos);
    } while(--length>1);
    out.appendCodeUnit(*pos);
}